

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  StringPiece SVar4;
  string basename;
  string local_68;
  StringPiece local_48;
  char local_38 [16];
  
  local_48.ptr_ = (filename->_M_dataplus)._M_p;
  local_48.length_ = filename->_M_string_length;
  __s = ".proto";
  if (10 < local_48.length_) {
    SVar4 = StringPiece::substr(&local_48,(size_type)(local_48.length_ + -0xb),0xffffffffffffffff);
    if ((SVar4.length_ == 0xb) && (__s = ".protodevel", SVar4.ptr_ != ".protodevel")) {
      iVar2 = bcmp(SVar4.ptr_,".protodevel",0xb);
      __s = ".proto";
      if (iVar2 == 0) {
        __s = ".protodevel";
      }
    }
  }
  local_48.ptr_ = local_38;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar3);
  if ((ulong)local_48.length_ <= (string *)filename->_M_string_length) {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,(long)filename->_M_string_length - local_48.length_,
                       (string *)local_48.length_);
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)filename);
      goto LAB_002726d7;
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + filename->_M_string_length);
LAB_002726d7:
  if (local_48.ptr_ != local_38) {
    operator_delete(local_48.ptr_);
  }
  ReplaceCharacters(&local_68,"-",'_');
  ReplaceCharacters(&local_68,"/",'.');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleName(const std::string& filename) {
  std::string basename = StripProto(filename);
  ReplaceCharacters(&basename, "-", '_');
  ReplaceCharacters(&basename, "/", '.');
  return basename + "_pb2";
}